

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O0

Context * build_context(char *profile,char *mainfn,uchar *tokenbuf,uint bufsize,
                       MOJOSHADER_swizzle *swiz,uint swizcount,MOJOSHADER_samplerMap *smap,
                       uint smapcount,MOJOSHADER_malloc m,MOJOSHADER_free f,void *d)

{
  uint uVar1;
  int iVar2;
  size_t sVar3;
  ErrorList *pEVar4;
  char *pcVar5;
  int profileid;
  Context *ctx;
  uint swizcount_local;
  MOJOSHADER_swizzle *swiz_local;
  uint bufsize_local;
  uchar *tokenbuf_local;
  char *mainfn_local;
  char *profile_local;
  
  if (m == (MOJOSHADER_malloc)0x0) {
    m = MOJOSHADER_internal_malloc;
  }
  if (f == (MOJOSHADER_free)0x0) {
    f = MOJOSHADER_internal_free;
  }
  profile_local = (char *)(*m)(0x580,d);
  if ((Context *)profile_local == (Context *)0x0) {
    profile_local = (char *)0x0;
  }
  else {
    memset(profile_local,0,0x580);
    ((Context *)profile_local)->malloc = m;
    ((Context *)profile_local)->free = f;
    ((Context *)profile_local)->malloc_data = d;
    ((Context *)profile_local)->tokens = (uint32 *)tokenbuf;
    ((Context *)profile_local)->orig_tokens = (uint32 *)tokenbuf;
    ((Context *)profile_local)->know_shader_size = (uint)(bufsize != 0);
    if (((Context *)profile_local)->know_shader_size == 0) {
      uVar1 = 0xffffffff;
    }
    else {
      uVar1 = bufsize >> 2;
    }
    ((Context *)profile_local)->tokencount = uVar1;
    ((Context *)profile_local)->swizzles = swiz;
    ((Context *)profile_local)->swizzles_count = swizcount;
    ((Context *)profile_local)->samplermap = smap;
    ((Context *)profile_local)->samplermap_count = smapcount;
    ((Context *)profile_local)->endline = "\n";
    sVar3 = strlen(((Context *)profile_local)->endline);
    ((Context *)profile_local)->endline_len = (int)sVar3;
    ((Context *)profile_local)->last_address_reg_component = -1;
    ((Context *)profile_local)->current_position = -2;
    ((Context *)profile_local)->texm3x2pad_dst0 = -1;
    ((Context *)profile_local)->texm3x2pad_src0 = -1;
    ((Context *)profile_local)->texm3x3pad_dst0 = -1;
    ((Context *)profile_local)->texm3x3pad_src0 = -1;
    ((Context *)profile_local)->texm3x3pad_dst1 = -1;
    ((Context *)profile_local)->texm3x3pad_src1 = -1;
    pEVar4 = errorlist_create(MallocBridge,FreeBridge,profile_local);
    ((Context *)profile_local)->errors = pEVar4;
    if (((Context *)profile_local)->errors == (ErrorList *)0x0) {
      (*f)(profile_local,d);
      profile_local = (char *)0x0;
    }
    else {
      iVar2 = set_output((Context *)profile_local,&((Context *)profile_local)->mainline);
      if (iVar2 == 0) {
        errorlist_destroy(((Context *)profile_local)->errors);
        (*f)(profile_local,d);
        profile_local = (char *)0x0;
      }
      else {
        if (mainfn != (char *)0x0) {
          sVar3 = strlen(mainfn);
          if (sVar3 < 0x38) {
            pcVar5 = StrDup((Context *)profile_local,mainfn);
            ((Context *)profile_local)->mainfn = pcVar5;
          }
          else {
            failf((Context *)profile_local,"Main function name \'%s\' is too big",mainfn);
          }
        }
        if (profile != (char *)0x0) {
          iVar2 = find_profile_id(profile);
          ((Context *)profile_local)->profileid = iVar2;
          if (iVar2 < 0) {
            failf((Context *)profile_local,"Profile \'%s\' is unknown or unsupported",profile);
          }
          else {
            ((Context *)profile_local)->profile = profiles + iVar2;
          }
        }
      }
    }
  }
  return (Context *)profile_local;
}

Assistant:

static Context *build_context(const char *profile,
                              const char *mainfn,
                              const unsigned char *tokenbuf,
                              const unsigned int bufsize,
                              const MOJOSHADER_swizzle *swiz,
                              const unsigned int swizcount,
                              const MOJOSHADER_samplerMap *smap,
                              const unsigned int smapcount,
                              MOJOSHADER_malloc m, MOJOSHADER_free f, void *d)
{
    if (m == NULL) m = MOJOSHADER_internal_malloc;
    if (f == NULL) f = MOJOSHADER_internal_free;

    Context *ctx = (Context *) m(sizeof (Context), d);
    if (ctx == NULL)
        return NULL;

    memset(ctx, '\0', sizeof (Context));
    ctx->malloc = m;
    ctx->free = f;
    ctx->malloc_data = d;
    ctx->tokens = (const uint32 *) tokenbuf;
    ctx->orig_tokens = (const uint32 *) tokenbuf;
    ctx->know_shader_size = (bufsize != 0);
    ctx->tokencount = ctx->know_shader_size ? (bufsize / sizeof (uint32)) : 0xFFFFFFFF;
    ctx->swizzles = swiz;
    ctx->swizzles_count = swizcount;
    ctx->samplermap = smap;
    ctx->samplermap_count = smapcount;
    ctx->endline = ENDLINE_STR;
    ctx->endline_len = strlen(ctx->endline);
    ctx->last_address_reg_component = -1;
    ctx->current_position = MOJOSHADER_POSITION_BEFORE;
    ctx->texm3x2pad_dst0 = -1;
    ctx->texm3x2pad_src0 = -1;
    ctx->texm3x3pad_dst0 = -1;
    ctx->texm3x3pad_src0 = -1;
    ctx->texm3x3pad_dst1 = -1;
    ctx->texm3x3pad_src1 = -1;

    ctx->errors = errorlist_create(MallocBridge, FreeBridge, ctx);
    if (ctx->errors == NULL)
    {
        f(ctx, d);
        return NULL;
    } // if

    if (!set_output(ctx, &ctx->mainline))
    {
        errorlist_destroy(ctx->errors);
        f(ctx, d);
        return NULL;
    } // if

    if (mainfn != NULL)
    {
        if (strlen(mainfn) > 55)  // !!! FIXME: just to keep things sane. Lots of hardcoded stack arrays...
            failf(ctx, "Main function name '%s' is too big", mainfn);
        else
            ctx->mainfn = StrDup(ctx, mainfn);
    } // if

    if (profile != NULL)
    {
        const int profileid = find_profile_id(profile);
        ctx->profileid = profileid;
        if (profileid >= 0)
            ctx->profile = &profiles[profileid];
        else
            failf(ctx, "Profile '%s' is unknown or unsupported", profile);
    } // if

    return ctx;
}